

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# core-test.cc
# Opt level: O0

void __thiscall BufferTest_Append_Test::TestBody(BufferTest_Append_Test *this)

{
  bool bVar1;
  undefined1 uVar2;
  char *actual_expression;
  char *pcVar3;
  AssertionResult gtest_ar_4;
  AssertionResult gtest_ar_3;
  AssertionResult gtest_ar_2;
  AssertionResult gtest_ar_1;
  AssertionResult gtest_ar;
  char *test;
  mock_buffer<char> buffer;
  char data [15];
  Matcher<unsigned_long> *in_stack_fffffffffffffdd8;
  mock_buffer<char> *in_stack_fffffffffffffde0;
  undefined7 in_stack_fffffffffffffde8;
  undefined1 in_stack_fffffffffffffdef;
  char *in_stack_fffffffffffffdf0;
  undefined4 in_stack_fffffffffffffdf8;
  int in_stack_fffffffffffffdfc;
  int line;
  mock_buffer<char> *in_stack_fffffffffffffe00;
  char *in_stack_fffffffffffffe08;
  Type type;
  undefined7 in_stack_fffffffffffffe10;
  undefined1 in_stack_fffffffffffffe17;
  unsigned_long in_stack_fffffffffffffe18;
  Matcher<unsigned_long> *in_stack_fffffffffffffe20;
  undefined7 in_stack_fffffffffffffe40;
  undefined1 in_stack_fffffffffffffe47;
  basic_buffer<char> *message;
  AssertHelper *in_stack_fffffffffffffe60;
  AssertionResult local_180 [2];
  undefined1 local_159;
  AssertionResult local_158 [2];
  undefined1 local_131;
  char *in_stack_fffffffffffffed0;
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  in_stack_fffffffffffffed8;
  int in_stack_fffffffffffffee4;
  char *in_stack_fffffffffffffee8;
  MockSpec<void_(unsigned_long)> *in_stack_fffffffffffffef0;
  AssertionResult local_e8 [2];
  AssertionResult local_c8 [2];
  char *local_a8;
  basic_buffer<char> local_a0 [5];
  
  message = local_a0;
  mock_buffer<char>::mock_buffer
            (in_stack_fffffffffffffe00,
             (char *)CONCAT44(in_stack_fffffffffffffdfc,in_stack_fffffffffffffdf8),
             (size_t)in_stack_fffffffffffffdf0);
  local_a8 = "test";
  fmt::v5::internal::basic_buffer<char>::append<char>
            ((basic_buffer<char> *)CONCAT17(in_stack_fffffffffffffe17,in_stack_fffffffffffffe10),
             in_stack_fffffffffffffe08,(char *)in_stack_fffffffffffffe00);
  pcVar3 = local_a8;
  actual_expression = fmt::v5::internal::basic_buffer<char>::operator[](local_a0,0);
  testing::internal::CmpHelperSTREQ
            ((char *)message,actual_expression,pcVar3,
             (char *)CONCAT17(in_stack_fffffffffffffe47,in_stack_fffffffffffffe40));
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_c8);
  if (!bVar1) {
    testing::Message::Message
              ((Message *)CONCAT17(in_stack_fffffffffffffe17,in_stack_fffffffffffffe10));
    testing::AssertionResult::failure_message((AssertionResult *)0x12051a);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)CONCAT17(in_stack_fffffffffffffe17,in_stack_fffffffffffffe10),
               (Type)((ulong)in_stack_fffffffffffffe08 >> 0x20),(char *)in_stack_fffffffffffffe00,
               in_stack_fffffffffffffdfc,in_stack_fffffffffffffdf0);
    testing::internal::AssertHelper::operator=(in_stack_fffffffffffffe60,(Message *)message);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffffde0);
    testing::Message::~Message((Message *)0x120577);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x1205cc);
  fmt::v5::internal::basic_buffer<char>::size(local_a0);
  testing::internal::EqHelper<false>::Compare<unsigned_int,unsigned_long>
            ((char *)CONCAT44(in_stack_fffffffffffffdfc,in_stack_fffffffffffffdf8),
             in_stack_fffffffffffffdf0,
             (uint *)CONCAT17(in_stack_fffffffffffffdef,in_stack_fffffffffffffde8),
             (unsigned_long *)in_stack_fffffffffffffde0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_e8);
  if (!bVar1) {
    testing::Message::Message
              ((Message *)CONCAT17(in_stack_fffffffffffffe17,in_stack_fffffffffffffe10));
    testing::AssertionResult::failure_message((AssertionResult *)0x120682);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)CONCAT17(in_stack_fffffffffffffe17,in_stack_fffffffffffffe10),
               (Type)((ulong)in_stack_fffffffffffffe08 >> 0x20),(char *)in_stack_fffffffffffffe00,
               in_stack_fffffffffffffdfc,in_stack_fffffffffffffdf0);
    testing::internal::AssertHelper::operator=(in_stack_fffffffffffffe60,(Message *)message);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffffde0);
    testing::Message::~Message((Message *)0x1206df);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x120737);
  fmt::v5::internal::basic_buffer<char>::resize
            (&in_stack_fffffffffffffde0->super_basic_buffer<char>,(size_t)in_stack_fffffffffffffdd8)
  ;
  testing::Matcher<unsigned_long>::Matcher(in_stack_fffffffffffffe20,in_stack_fffffffffffffe18);
  mock_buffer<char>::gmock_do_grow(in_stack_fffffffffffffde0,in_stack_fffffffffffffdd8);
  testing::internal::MockSpec<void_(unsigned_long)>::InternalExpectedAt
            (in_stack_fffffffffffffef0,in_stack_fffffffffffffee8,in_stack_fffffffffffffee4,
             (char *)in_stack_fffffffffffffed8.ptr_,in_stack_fffffffffffffed0);
  testing::Matcher<unsigned_long>::~Matcher((Matcher<unsigned_long> *)0x1207ae);
  fmt::v5::internal::basic_buffer<char>::append<char>
            ((basic_buffer<char> *)CONCAT17(in_stack_fffffffffffffe17,in_stack_fffffffffffffe10),
             in_stack_fffffffffffffe08,(char *)in_stack_fffffffffffffe00);
  type = (Type)((ulong)in_stack_fffffffffffffe08 >> 0x20);
  local_131 = 0x74;
  fmt::v5::internal::basic_buffer<char>::operator[](local_a0,10);
  testing::internal::EqHelper<false>::Compare<char,char>
            ((char *)CONCAT44(in_stack_fffffffffffffdfc,in_stack_fffffffffffffdf8),
             in_stack_fffffffffffffdf0,
             (char *)CONCAT17(in_stack_fffffffffffffdef,in_stack_fffffffffffffde8),
             (char *)in_stack_fffffffffffffde0);
  uVar2 = testing::AssertionResult::operator_cast_to_bool
                    ((AssertionResult *)&stack0xfffffffffffffed0);
  if (!(bool)uVar2) {
    testing::Message::Message((Message *)CONCAT17(uVar2,in_stack_fffffffffffffe10));
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)0x1208a6);
    type = (Type)((ulong)pcVar3 >> 0x20);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)CONCAT17(uVar2,in_stack_fffffffffffffe10),type,
               (char *)in_stack_fffffffffffffe00,in_stack_fffffffffffffdfc,in_stack_fffffffffffffdf0
              );
    testing::internal::AssertHelper::operator=(in_stack_fffffffffffffe60,(Message *)message);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffffde0);
    testing::Message::~Message((Message *)0x120903);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x120958);
  local_159 = 0x65;
  pcVar3 = fmt::v5::internal::basic_buffer<char>::operator[](local_a0,0xb);
  testing::internal::EqHelper<false>::Compare<char,char>
            ((char *)CONCAT44(in_stack_fffffffffffffdfc,in_stack_fffffffffffffdf8),
             in_stack_fffffffffffffdf0,
             (char *)CONCAT17(in_stack_fffffffffffffdef,in_stack_fffffffffffffde8),
             (char *)in_stack_fffffffffffffde0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_158);
  line = CONCAT13(bVar1,(int3)in_stack_fffffffffffffdfc);
  if (!bVar1) {
    testing::Message::Message((Message *)CONCAT17(uVar2,in_stack_fffffffffffffe10));
    in_stack_fffffffffffffdf0 =
         testing::AssertionResult::failure_message((AssertionResult *)0x120a0c);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)CONCAT17(uVar2,in_stack_fffffffffffffe10),type,pcVar3,line,
               in_stack_fffffffffffffdf0);
    testing::internal::AssertHelper::operator=(in_stack_fffffffffffffe60,(Message *)message);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffffde0);
    testing::Message::~Message((Message *)0x120a69);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x120abe);
  fmt::v5::internal::basic_buffer<char>::size(local_a0);
  testing::internal::EqHelper<false>::Compare<unsigned_int,unsigned_long>
            ((char *)CONCAT44(line,in_stack_fffffffffffffdf8),in_stack_fffffffffffffdf0,
             (uint *)CONCAT17(in_stack_fffffffffffffdef,in_stack_fffffffffffffde8),
             (unsigned_long *)in_stack_fffffffffffffde0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_180);
  if (!bVar1) {
    testing::Message::Message((Message *)CONCAT17(uVar2,in_stack_fffffffffffffe10));
    in_stack_fffffffffffffde0 =
         (mock_buffer<char> *)testing::AssertionResult::failure_message((AssertionResult *)0x120b74)
    ;
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)CONCAT17(uVar2,in_stack_fffffffffffffe10),type,pcVar3,line,
               in_stack_fffffffffffffdf0);
    testing::internal::AssertHelper::operator=(in_stack_fffffffffffffe60,(Message *)message);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffffde0);
    testing::Message::~Message((Message *)0x120bd1);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x120c26);
  mock_buffer<char>::~mock_buffer(in_stack_fffffffffffffde0);
  return;
}

Assistant:

TEST(BufferTest, Append) {
  char data[15];
  mock_buffer<char> buffer(data, 10);
  const char *test = "test";
  buffer.append(test, test + 5);
  EXPECT_STREQ(test, &buffer[0]);
  EXPECT_EQ(5u, buffer.size());
  buffer.resize(10);
  EXPECT_CALL(buffer, do_grow(12));
  buffer.append(test, test + 2);
  EXPECT_EQ('t', buffer[10]);
  EXPECT_EQ('e', buffer[11]);
  EXPECT_EQ(12u, buffer.size());
}